

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

AttributeInstanceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AttributeInstanceSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>&,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,
          SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *args_2,Token *args_3,
          Token *args_4)

{
  Token openParen;
  Token openStar;
  Token closeStar;
  Token closeParen;
  AttributeInstanceSyntax *this_00;
  
  this_00 = (AttributeInstanceSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AttributeInstanceSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (AttributeInstanceSyntax *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  openParen.kind = args->kind;
  openParen._2_1_ = args->field_0x2;
  openParen.numFlags.raw = (args->numFlags).raw;
  openParen.rawLen = args->rawLen;
  openParen.info = args->info;
  openStar.kind = args_1->kind;
  openStar._2_1_ = args_1->field_0x2;
  openStar.numFlags.raw = (args_1->numFlags).raw;
  openStar.rawLen = args_1->rawLen;
  openStar.info = args_1->info;
  closeParen.kind = args_4->kind;
  closeParen._2_1_ = args_4->field_0x2;
  closeParen.numFlags.raw = (args_4->numFlags).raw;
  closeParen.rawLen = args_4->rawLen;
  closeParen.info = args_4->info;
  closeStar.kind = args_3->kind;
  closeStar._2_1_ = args_3->field_0x2;
  closeStar.numFlags.raw = (args_3->numFlags).raw;
  closeStar.rawLen = args_3->rawLen;
  closeStar.info = args_3->info;
  slang::syntax::AttributeInstanceSyntax::AttributeInstanceSyntax
            (this_00,openParen,openStar,args_2,closeStar,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }